

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  bool bVar3;
  uint val;
  uint uVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  xmlParserErrors code;
  uint uVar11;
  int iVar12;
  int l;
  int local_34;
  
  iVar9 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar9 = 50000;
  }
  bVar1 = *ctxt->input->cur;
  uVar11 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar6 = (xmlChar *)0x0;
      code = XML_ERR_LITERAL_NOT_STARTED;
LAB_001361ef:
      xmlFatalErr(ctxt,code,(char *)0x0);
      return pxVar6;
    }
    uVar11 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMalloc)(100);
  if (pxVar6 != (xmlChar *)0x0) {
    iVar10 = 0;
    iVar12 = 100;
    do {
      val = xmlCurrentChar(ctxt,&local_34);
      if (val == 0x200000) {
        val = 0xfffd;
      }
      if ((int)val < 0x100) {
        if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0)))) {
          pxVar6[iVar10] = '\0';
LAB_00136299:
          code = XML_ERR_LITERAL_NOT_FINISHED;
          goto LAB_001361ef;
        }
        if (val == uVar11) {
          pxVar6[iVar10] = '\0';
LAB_0013623c:
          xmlNextChar(ctxt);
          return pxVar6;
        }
      }
      else if ((val == uVar11) ||
              ((val - 0xfffe < 0xffffe002 && val - 0x110000 < 0xfff00000) && 0xd7ff < val)) {
        pxVar6[iVar10] = '\0';
        if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) goto LAB_0013623c;
        goto LAB_00136299;
      }
      pxVar7 = pxVar6;
      if (iVar12 <= iVar10 + 5) {
        if (iVar12 < 1) {
          iVar12 = 1;
        }
        else {
          if (iVar9 <= iVar12) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
            (*xmlFree)(pxVar6);
            return (xmlChar *)0x0;
          }
          uVar4 = iVar12 + 1U >> 1;
          bVar3 = (int)(iVar9 - uVar4) < iVar12;
          iVar12 = uVar4 + iVar12;
          if (bVar3) {
            iVar12 = iVar9;
          }
        }
        pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)iVar12);
        if (pxVar7 == (xmlChar *)0x0) goto LAB_00136246;
      }
      if (val < 0x80) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        pxVar7[lVar8] = (xmlChar)val;
      }
      else {
        iVar5 = xmlCopyCharMultiByte(pxVar7 + iVar10,val);
        iVar10 = iVar5 + iVar10;
      }
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + local_34;
      pxVar6 = pxVar7;
    } while( true );
  }
LAB_00136252:
  xmlCtxtErrMemory(ctxt);
  return (xmlChar *)0x0;
LAB_00136246:
  (*xmlFree)(pxVar6);
  goto LAB_00136252;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, cur);
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}